

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

JavascriptString * Js::JavascriptString::ToCaseCore<true,true>(JavascriptString *pThis)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  uint32 uVar4;
  int iVar5;
  Type *this;
  Recycler *pRVar6;
  JavascriptString *pJVar7;
  undefined4 extraout_var;
  undefined4 *puVar8;
  JavascriptLibrary *this_00;
  CharStringCache *this_01;
  undefined4 extraout_var_00;
  charcount_t actualStringLength;
  TrackAllocData local_100;
  char16_t *local_d8;
  char16 *buffer;
  charcount_t bufferLength;
  charcount_t requiredStringLength;
  undefined8 local_c0;
  TrackAllocData local_b8;
  char16_t *local_90;
  char16 *guessBuffer;
  charcount_t guessBufferLength;
  char16 cur;
  charcount_t i_1;
  char16 diffBetweenCases;
  undefined8 local_70;
  TrackAllocData local_68;
  char16_t *local_40;
  char16 *ret;
  charcount_t i;
  bool isAscii;
  char16 *pThisString;
  charcount_t pThisLength;
  ApiError error;
  ScriptContext *scriptContext;
  JavascriptString *pThis_local;
  
  scriptContext = (ScriptContext *)pThis;
  cVar3 = GetLength(pThis);
  if (cVar3 == 0) {
    return (JavascriptString *)scriptContext;
  }
  this = Memory::WriteBarrierPtr<Js::Type>::operator->
                   ((WriteBarrierPtr<Js::Type> *)&scriptContext->super_ScriptContextBase);
  _pThisLength = Js::Type::GetScriptContext(this);
  pThisString._4_4_ = 0;
  pThisString._0_4_ = GetLength((JavascriptString *)scriptContext);
  _i = GetString((JavascriptString *)scriptContext);
  ret._7_1_ = '\x01';
  ret._0_4_ = 0;
  do {
    if ((charcount_t)pThisString <= (uint)ret) {
LAB_0133147b:
      if (ret._7_1_ != '\0') {
        pRVar6 = ScriptContext::GetRecycler(_pThisLength);
        uVar4 = UInt32Math::Add((charcount_t)pThisString,1);
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_68,(type_info *)&char16_t::typeinfo,0,(ulong)uVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                   ,0x918);
        pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_68);
        uVar4 = UInt32Math::Add((charcount_t)pThisString,1);
        _i_1 = Memory::Recycler::AllocLeaf;
        local_70 = 0;
        local_40 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                             ((Memory *)pRVar6,(Recycler *)Memory::Recycler::AllocLeaf,0,
                              (ulong)uVar4);
        cur = L' ';
        for (guessBufferLength = 0; guessBufferLength < (charcount_t)pThisString;
            guessBufferLength = guessBufferLength + 1) {
          guessBuffer._6_2_ = _i[guessBufferLength];
          if (((ushort)guessBuffer._6_2_ < 0x61) || (0x7a < (ushort)guessBuffer._6_2_)) {
            local_40[guessBufferLength] = guessBuffer._6_2_;
          }
          else {
            local_40[guessBufferLength] = guessBuffer._6_2_ + L'￠';
          }
        }
        local_40[(charcount_t)pThisString] = L'\0';
        pJVar7 = NewWithBuffer(local_40,(charcount_t)pThisString,_pThisLength);
        return pJVar7;
      }
      guessBuffer._0_4_ = UInt32Math::Add((charcount_t)pThisString,1);
      pRVar6 = ScriptContext::GetRecycler(_pThisLength);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_b8,(type_info *)&char16_t::typeinfo,0,(ulong)(uint32)guessBuffer,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                 ,0x948);
      pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_b8);
      _bufferLength = Memory::Recycler::AllocLeaf;
      local_c0 = 0;
      local_90 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                           ((Memory *)pRVar6,(Recycler *)Memory::Recycler::AllocLeaf,0,
                            (ulong)(uint32)guessBuffer);
      iVar5 = (*(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x65])();
      cVar3 = GetLength((JavascriptString *)scriptContext);
      buffer._4_4_ = PlatformAgnostic::UnicodeText::ChangeStringLinguisticCase<true,true>
                               ((char16 *)CONCAT44(extraout_var,iVar5),cVar3,local_90,
                                (uint32)guessBuffer,(ApiError *)((long)&pThisString + 4));
      if (pThisString._4_4_ != 4) {
        if ((buffer._4_4_ == 0) || (bVar2 = IsValidCharCount((ulong)buffer._4_4_), !bVar2)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                      ,0x956,
                                      "(requiredStringLength > 0 && IsValidCharCount(requiredStringLength))"
                                      ,
                                      "requiredStringLength > 0 && IsValidCharCount(requiredStringLength)"
                                     );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        if (pThisString._4_4_ == 0) {
          if (buffer._4_4_ == 1) {
            this_00 = ScriptContext::GetLibrary(_pThisLength);
            this_01 = JavascriptLibrary::GetCharStringCache(this_00);
            pThis_local = CharStringCache::GetStringForChar(this_01,*local_90);
          }
          else {
            pThis_local = NewWithBuffer(local_90,buffer._4_4_,_pThisLength);
          }
        }
        else {
          if (pThisString._4_4_ != 3) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                        ,0x966,"(error == ApiError::InsufficientBuffer)",
                                        "error == ApiError::InsufficientBuffer");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
          if (buffer._4_4_ < 2) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                        ,0x974,"(requiredStringLength > 1)",
                                        "requiredStringLength > 1");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
          buffer._0_4_ = UInt32Math::Add(buffer._4_4_,1);
          pRVar6 = ScriptContext::GetRecycler(_pThisLength);
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_100,(type_info *)&char16_t::typeinfo,0,(ulong)(uint32)buffer,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                     ,0x977);
          pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_100);
          local_d8 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                               ((Memory *)pRVar6,(Recycler *)Memory::Recycler::AllocLeaf,0,
                                (ulong)(uint32)buffer);
          iVar5 = (*(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x65])();
          cVar3 = GetLength((JavascriptString *)scriptContext);
          cVar3 = PlatformAgnostic::UnicodeText::ChangeStringLinguisticCase<true,true>
                            ((char16 *)CONCAT44(extraout_var_00,iVar5),cVar3,local_d8,(uint32)buffer
                             ,(ApiError *)((long)&pThisString + 4));
          if ((cVar3 != buffer._4_4_) || (pThisString._4_4_ != 0)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                        ,0x979,
                                        "(actualStringLength == requiredStringLength && error == ApiError::NoError)"
                                        ,
                                        "actualStringLength == requiredStringLength && error == ApiError::NoError"
                                       );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar8 = 0;
          }
          pThis_local = NewWithBuffer(local_d8,cVar3,_pThisLength);
        }
        return pThis_local;
      }
      Throw::OutOfMemory();
    }
    if (0x7f < (ushort)_i[(uint)ret]) {
      ret._7_1_ = '\0';
      goto LAB_0133147b;
    }
    ret._0_4_ = (uint)ret + 1;
  } while( true );
}

Assistant:

JavascriptString* JavascriptString::ToCaseCore(JavascriptString* pThis)
    {
        using namespace PlatformAgnostic::UnicodeText;
        if (pThis->GetLength() == 0)
        {
            return pThis;
        }

        ScriptContext* scriptContext = pThis->type->GetScriptContext();
        ApiError error = ApiError::NoError;
        charcount_t pThisLength = pThis->GetLength();

        if (useInvariant)
        {
            const char16 *pThisString = pThis->GetString();
            bool isAscii = true;
            for (charcount_t i = 0; i < pThisLength; i++)
            {
                if (pThisString[i] >= 0x80)
                {
                    isAscii = false;
                    break;
                }
            }

            if (isAscii)
            {
                char16 *ret = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, UInt32Math::Add(pThisLength, 1));
                const char16 diffBetweenCases = 32;
                for (charcount_t i = 0; i < pThisLength; i++)
                {
                    char16 cur = pThisString[i];
                    if (toUpper)
                    {
                        if (cur >= _u('a') && cur <= _u('z'))
                        {
                            ret[i] = cur - diffBetweenCases;
                        }
                        else
                        {
                            ret[i] = cur;
                        }
                    }
                    else
                    {
                        if (cur >= _u('A') && cur <= _u('Z'))
                        {
                            ret[i] = cur + diffBetweenCases;
                        }
                        else
                        {
                            ret[i] = cur;
                        }
                    }
                }

                ret[pThisLength] = 0;

                return JavascriptString::NewWithBuffer(ret, pThisLength, scriptContext);
            }
        }

        // pre-flight to get the length required, as it may be longer than the original string
        // ICU and Win32(/POSIX) implementations of these functions differ slightly in how to get the required number of characters.
        // For Win32 (LCMapStringEx), you must provide nullptr/0, as providing a buffer that is too small will cause an error and will *not*
        // report the number of characters required. For ICU, however, you can provide a buffer that is too short, and it will still return
        // the length it actually needs.
        //
        // This is a small performance optimization because to(Upper|Lower)Case is can show up hot in certain scenarios.
        // ICU still allows nullptr/0 to be passed to get the string length, and more conservative callers of ChangeStringLinguisticCase should do just that.
        // TODO(jahorto): A truly PlatformAgnostic API wouldn't require cases like this. Once PlatformAgnostic is allowed to use
        // Chakra's memory subsystems, this API should be converted to one that only takes a source string and returns a Recycler-allocated
        // string in the correct case, performed using whatever operation is the fastest available on that platform.
#ifdef INTL_ICU
        charcount_t guessBufferLength = UInt32Math::Add(pThisLength, 1);
        char16 *guessBuffer = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, guessBufferLength);
#else
        charcount_t guessBufferLength = 0;
        char16 *guessBuffer = nullptr;
#endif

        charcount_t requiredStringLength = ChangeStringLinguisticCase<toUpper, useInvariant>(pThis->GetSz(), pThis->GetLength(), guessBuffer, guessBufferLength, &error);
        if (error == ApiError::OutOfMemory)
        {
            Throw::OutOfMemory();
        }

        // We exit ToCaseCore early if the source string is 0-length, and casing a non-zero length string should
        // never result in a zero-length string.
        AssertOrFailFast(requiredStringLength > 0 && IsValidCharCount(requiredStringLength));

#ifdef INTL_ICU
        if (error == ApiError::NoError)
        {
            if (requiredStringLength == 1)
            {
                // don't create a new string in case we may have cached this string earlier
                return scriptContext->GetLibrary()->GetCharStringCache().GetStringForChar(guessBuffer[0]);
            }
            else
            {
                // use requiredStringLength instead of guessBufferLength because the string can get shorter
                return JavascriptString::NewWithBuffer(guessBuffer, requiredStringLength, scriptContext);
            }
        }
        AssertOrFailFast(error == ApiError::InsufficientBuffer);
#else
        AssertOrFailFast(error == ApiError::NoError);
        if (requiredStringLength == 1)
        {
            // this one-char string special case is only for non-ICU because there should never be a case where the error
            // was InsufficientBufer but the required length was 1
            char16 buffer[2] = { pThis->GetSz()[0], 0 };
            charcount_t actualStringLength = ChangeStringLinguisticCase<toUpper, useInvariant>(pThis->GetSz(), pThis->GetLength(), buffer, 2, &error);
            AssertOrFailFast(actualStringLength == 1 && error == ApiError::NoError);
            return scriptContext->GetLibrary()->GetCharStringCache().GetStringForChar(buffer[0]);
        }
#endif

        AssertOrFailFast(requiredStringLength > 1);

        charcount_t bufferLength = UInt32Math::Add(requiredStringLength, 1);
        char16* buffer = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, bufferLength);
        charcount_t actualStringLength = ChangeStringLinguisticCase<toUpper, useInvariant>(pThis->GetSz(), pThis->GetLength(), buffer, bufferLength, &error);
        AssertOrFailFast(actualStringLength == requiredStringLength && error == ApiError::NoError);
        return JavascriptString::NewWithBuffer(buffer, actualStringLength, scriptContext);
    }